

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O3

CharCount __thiscall
UnifiedRegex::ConcatNode::TransferPass0(ConcatNode *this,Compiler *compiler,Char *litbuf)

{
  ConcatNode **ppCVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 *puVar6;
  ConcatNode *pCVar7;
  uint uVar8;
  
  ThreadContext::ProbeStackNoDispose
            (compiler->scriptContext->threadContext,0x6000,compiler->scriptContext,(PVOID)0x0);
  if (this->tail == (ConcatNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x70a,"(tail != 0)","tail != 0");
    if (!bVar3) {
LAB_00e99245:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  else {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  uVar8 = 0;
  pCVar7 = (ConcatNode *)0x0;
  do {
    if (this->head->tag == Concat) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x711,"(curr->head->tag != Concat)","curr->head->tag != Concat");
      if (!bVar3) goto LAB_00e99245;
      *puVar6 = 0;
    }
    if (pCVar7 != (ConcatNode *)0x0) {
      iVar4 = (**pCVar7->head->_vptr_Node)();
      if (iVar4 != 0) {
        iVar4 = (**this->head->_vptr_Node)();
        if (iVar4 != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                             ,0x712,
                             "(prev == 0 || !(prev->head->LiteralLength() > 0 && curr->head->LiteralLength() > 0))"
                             ,
                             "prev == 0 || !(prev->head->LiteralLength() > 0 && curr->head->LiteralLength() > 0)"
                            );
          if (!bVar3) goto LAB_00e99245;
          *puVar6 = 0;
        }
      }
    }
    uVar5 = (*this->head->_vptr_Node[3])(this->head,compiler,litbuf);
    bVar3 = CARRY4(uVar8,uVar5);
    uVar8 = uVar8 + uVar5;
    if (bVar3) {
      Math::DefaultOverflowPolicy();
    }
    ppCVar1 = &this->tail;
    pCVar7 = this;
    this = *ppCVar1;
    if (*ppCVar1 == (ConcatNode *)0x0) {
      return uVar8;
    }
  } while( true );
}

Assistant:

CharCount ConcatNode::TransferPass0(Compiler& compiler, const Char* litbuf)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        Assert(tail != 0);
        CharCount n = 0;
#if DBG
        ConcatNode* prev = 0;
#endif
        for (ConcatNode* curr = this; curr != 0; curr = curr->tail)
        {
            Assert(curr->head->tag != Concat);
            Assert(prev == 0 || !(prev->head->LiteralLength() > 0 && curr->head->LiteralLength() > 0));
            n = UInt32Math::Add(n, curr->head->TransferPass0(compiler, litbuf));
#if DBG
            prev = curr;
#endif
        }
        return n;
    }